

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

Matrix6x1 * __thiscall
iDynTree::BerdyHelper::getBiasTermJointAccelerationPropagation
          (Matrix6x1 *__return_storage_ptr__,BerdyHelper *this,IJointConstPtr joint,
          LinkIndex parentLinkIdx,LinkIndex childLinkIdx,Transform *child_X_parent)

{
  uint uVar1;
  long lVar2;
  Rotation *pRVar3;
  Position *pPVar4;
  double *pdVar5;
  size_t localDof;
  ulong uVar6;
  Vector3 parentBodyAngularVel;
  SpatialMotionVector SleftTrivialzed;
  SpatialMotionVector local_2b0;
  Vector3 *local_280 [6];
  Twist relJointVelInMixed;
  undefined1 local_238 [24];
  Position parent_o_child;
  SpatialMotionVector Smixed;
  Position *local_1d0 [2];
  Vector3 *local_1c0 [2];
  Rotation child_R_parent;
  type local_168 [2];
  Transform mixed_X_leftTrivialized;
  Rotation parent_R_child;
  Transform parent_X_child;
  
  MatrixFixSize<6U,_1U>::zero(__return_storage_ptr__);
  lVar2 = iDynTree::LinkVelArray::operator()(&this->m_linkVels,parentLinkIdx);
  parentBodyAngularVel.m_data[0] = *(double *)(lVar2 + 0x18);
  parentBodyAngularVel.m_data[1] = *(double *)(lVar2 + 0x20);
  parentBodyAngularVel.m_data[2] = *(double *)(lVar2 + 0x28);
  pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation(&child_R_parent,pRVar3);
  iDynTree::Transform::inverse();
  pPVar4 = (Position *)iDynTree::Transform::getPosition();
  iDynTree::Position::Position(&parent_o_child,pPVar4);
  pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation(&parent_R_child,pRVar3);
  iDynTree::Position::Zero();
  iDynTree::Transform::Transform
            (&mixed_X_leftTrivialized,&parent_R_child,(Position *)&SleftTrivialzed);
  SpatialVector<iDynTree::SpatialMotionVector>::Zero();
  iDynTree::Twist::Twist(&relJointVelInMixed,&SleftTrivialzed);
  uVar6 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)joint + 0x20))(joint);
    if (uVar1 <= uVar6) break;
    (**(code **)(*(long *)joint + 0x60))
              (&SleftTrivialzed,joint,uVar6 & 0xffffffff,childLinkIdx,parentLinkIdx);
    iDynTree::Transform::operator*
              ((Transform *)&Smixed,(SpatialMotionVector *)&mixed_X_leftTrivialized);
    lVar2 = (**(code **)(*(long *)joint + 0xc0))(joint);
    pdVar5 = (double *)
             iDynTree::VectorDynSize::operator()((VectorDynSize *)&this->m_jointVel,lVar2 + uVar6);
    iDynTree::SpatialMotionVector::operator*(&local_2b0,*pdVar5);
    iDynTree::Twist::Twist((Twist *)local_280,&local_2b0);
    iDynTree::Twist::operator+((Twist *)local_168,&relJointVelInMixed);
    iDynTree::Twist::operator=(&relJointVelInMixed,(Twist *)local_168);
    uVar6 = uVar6 + 1;
  }
  local_280[0] = &parentBodyAngularVel;
  local_2b0.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)&relJointVelInMixed;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (local_168,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
             local_280,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_2b0);
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
  [2] = 2.0;
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       0.0;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.
  m_data[0] = (double)&child_R_parent;
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)__return_storage_ptr__;
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (double)__return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)&Smixed,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)&SleftTrivialzed);
  local_280[0] = &parentBodyAngularVel;
  local_2b0.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)local_238;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (local_168,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
             local_280,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_2b0);
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)&child_R_parent;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
  [0] = (double)(__return_storage_ptr__->m_data + 3);
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.
  m_data[1] = 1.48219693752374e-323;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
  [2] = (double)__return_storage_ptr__;
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (double)local_168;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)&SleftTrivialzed,
             (Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)&Smixed);
  local_2b0.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)&parentBodyAngularVel;
  local_1d0[0] = &parent_o_child;
  local_1c0[0] = (Vector3 *)
                 local_2b0.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                 super_Vector3.m_data[0];
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((type *)local_280,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
             local_1c0,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_1d0);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_2b0,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_280);
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (double)&child_R_parent;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.
  m_data[1] = 0.0;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
  [0] = (double)__return_storage_ptr__;
  SleftTrivialzed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
  [2] = (double)__return_storage_ptr__;
  Smixed.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (double)local_168;
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>>
  ::operator+=((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>>
                *)&SleftTrivialzed,
               (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&Smixed);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x1 BerdyHelper::getBiasTermJointAccelerationPropagation(IJointConstPtr joint,
                                                               const LinkIndex parentLinkIdx,
                                                               const LinkIndex childLinkIdx,
                                                               const Transform &child_X_parent)
{
    Matrix6x1 biasTerm;
    biasTerm.zero();

    auto biasTermEig = toEigen(biasTerm);

    // Implementing equation 36 in https://www.sharelatex.com/project/59439ec80788901873a803fb
    Vector3 parentBodyAngularVel = m_linkVels(parentLinkIdx).getAngularVec3();

    Rotation  child_R_parent = child_X_parent.getRotation();
    Transform parent_X_child = child_X_parent.inverse();
    Position  parent_o_child = parent_X_child.getPosition();
    Rotation  parent_R_child = parent_X_child.getRotation();
    Transform mixed_X_leftTrivialized = Transform(parent_R_child, Position::Zero());

    // Compute the mixed relative velocity of the child w.r.t to the parent
    Twist relJointVelInMixed = Twist::Zero();
    for (size_t localDof=0; localDof < joint->getNrOfDOFs(); localDof++)
    {
        SpatialMotionVector SleftTrivialzed = joint->getMotionSubspaceVector(localDof, childLinkIdx, parentLinkIdx);
        SpatialMotionVector Smixed = mixed_X_leftTrivialized*SleftTrivialzed;

        relJointVelInMixed = relJointVelInMixed + (Smixed*m_jointVel(joint->getDOFsOffset()+localDof));
    }

    // Compute the first term
    biasTermEig.segment<3>(0) = 2*toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getLinearVec3())));
    biasTermEig.segment<3>(3) = toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getAngularVec3())));

    // Compute the second term
    biasTermEig.segment<3>(0) += toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(parentBodyAngularVel).cross(toEigen(parent_o_child))));

    return biasTerm;
}